

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidConvolution3DNoBias(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  Convolution3DLayerParams *this_02;
  WeightParams *this_03;
  ostream *poVar5;
  undefined1 local_118 [8];
  Result res;
  int i;
  Convolution3DLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  int pad_right;
  int pad_left;
  int pad_bottom;
  int pad_top;
  int pad_back;
  int pad_front;
  int dilation_width;
  int dilation_height;
  int dilation_depth;
  int stride_width;
  int stride_height;
  int stride_depth;
  int nGroups;
  int kernel_width;
  int kernel_height;
  int kernel_depth;
  int output_channels;
  int input_channels;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&output_channels);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"input",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  CoreML::Specification::ArrayFeatureType::add_shape(this,3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0x20);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"probs",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&output_channels);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution3d(this_01);
  CoreML::Specification::Convolution3DLayerParams::set_inputchannels(this_02,3);
  CoreML::Specification::Convolution3DLayerParams::set_outputchannels(this_02,3);
  CoreML::Specification::Convolution3DLayerParams::set_kerneldepth(this_02,3);
  CoreML::Specification::Convolution3DLayerParams::set_kernelheight(this_02,3);
  CoreML::Specification::Convolution3DLayerParams::set_kernelwidth(this_02,3);
  CoreML::Specification::Convolution3DLayerParams::set_ngroups(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_stridedepth(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_strideheight(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_stridewidth(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationdepth(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationheight(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationwidth(this_02,1);
  CoreML::Specification::Convolution3DLayerParams::set_paddingtype
            (this_02,Convolution3DLayerParams_PaddingType_CUSTOM);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingfront(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingback(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingtop(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingbottom(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingleft(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingright(this_02,0);
  CoreML::Specification::Convolution3DLayerParams::set_hasbias(this_02,true);
  for (res.m_message.field_2._12_4_ = 0; (int)res.m_message.field_2._12_4_ < 0xf3;
      res.m_message.field_2._12_4_ = res.m_message.field_2._12_4_ + 1) {
    this_03 = CoreML::Specification::Convolution3DLayerParams::mutable_weights(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(this_03,1.0);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_118,(Model *)&output_channels);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_118);
  if (m1._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6d0);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_118);
  CoreML::Specification::Model::~Model((Model *)&output_channels);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidConvolution3DNoBias() {

    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);

    params->set_hasbias(true);

    // Fill Weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying any biases should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}